

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 tcu::sampleLevelArray2DOffset
               (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float s,float t,
               float lod,IVec3 *offset)

{
  int iVar1;
  int iVar2;
  IVec3 *offset_00;
  FilterMode filter;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  Sampler *sampler_00;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Db;
  ulong uVar7;
  Vector<float,_4> VVar8;
  Vec4 VVar9;
  Vec4 VVar10;
  Vec4 t0;
  tcu local_60 [16];
  tcu local_50 [16];
  Vec4 t1;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined8 uVar13;
  undefined8 uVar14;
  
  uVar7 = CONCAT44(in_XMM1_Db,t);
  sampler_00 = (Sampler *)CONCAT44(in_register_00000034,numLevels);
  iVar1 = offset[1].m_data[lod <= (float)offset[1].m_data[2]];
  filter = (FilterMode)offset;
  switch(iVar1) {
  case 0:
    offset_00 = (IVec3 *)0x0;
    break;
  case 1:
    offset_00 = (IVec3 *)0x1;
    break;
  case 2:
  case 4:
    iVar4 = (int)sampler + -1;
    fVar6 = ceilf(lod + 0.5);
    iVar5 = (int)fVar6 + -1;
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
    iVar2 = 0;
    if (-1 < iVar5) {
      iVar2 = iVar4;
    }
    offset_00 = (IVec3 *)(ulong)(iVar1 == 4);
    sampler_00 = (Sampler *)(&sampler_00->wrapS + (long)iVar2 * 10);
    uVar7 = (ulong)(uint)t;
    break;
  case 3:
  case 5:
    iVar5 = (int)sampler + -1;
    fVar6 = floorf(lod);
    iVar2 = (int)fVar6;
    iVar4 = iVar5;
    if (iVar2 < iVar5) {
      iVar4 = iVar2;
    }
    iVar3 = 0;
    if (-1 < iVar2) {
      iVar3 = iVar4;
    }
    if (iVar3 + 1 <= iVar5) {
      iVar5 = iVar3 + 1;
    }
    ConstPixelBufferAccess::sample2DOffset
              ((ConstPixelBufferAccess *)&t0,(Sampler *)(&sampler_00->wrapS + (long)iVar3 * 10),
               filter,s,t,(IVec3 *)(ulong)(iVar1 == 5));
    ConstPixelBufferAccess::sample2DOffset
              ((ConstPixelBufferAccess *)&t1,(Sampler *)(&sampler_00->wrapS + (long)iVar5 * 10),
               filter,s,t,(IVec3 *)(ulong)(iVar1 == 5));
    operator*(local_50,1.0 - (lod - fVar6),&t0);
    operator*(local_60,lod - fVar6,(Vector<float,_4> *)&t1);
    VVar8 = operator+((tcu *)levels,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_60);
    VVar10.m_data[0] = VVar8.m_data[0];
    auVar11._4_4_ = VVar8.m_data[1];
    register0x00001240 = VVar8.m_data[2];
    register0x00001244 = VVar8.m_data[3];
    return (Vec4)VVar10.m_data;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)levels,0.0);
    VVar9.m_data[0] = (float)(int)extraout_XMM0_Qa;
    auVar12._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    register0x00001240 = (float)(int)uVar7;
    register0x00001244 = (float)(int)(uVar7 >> 0x20);
    return (Vec4)VVar9.m_data;
  }
  VVar9 = ConstPixelBufferAccess::sample2DOffset(levels,sampler_00,filter,s,(float)uVar7,offset_00);
  return (Vec4)VVar9.m_data;
}

Assistant:

Vec4 sampleLevelArray2DOffset (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float s, float t, float lod, const IVec3& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample2DOffset(sampler, filterMode, s, t, offset);
		case Sampler::LINEAR:	return levels[0].sample2DOffset(sampler, filterMode, s, t, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample2DOffset(sampler, levelFilter, s, t, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			tcu::Vec4			t0			= levels[level0].sample2DOffset(sampler, levelFilter, s, t, offset);
			tcu::Vec4			t1			= levels[level1].sample2DOffset(sampler, levelFilter, s, t, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}